

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quath *value)

{
  bool bVar1;
  undefined1 auVar2 [16];
  half4 v;
  half4 local_10;
  
  bVar1 = ReadBasicType(this,&local_10);
  if (bVar1) {
    auVar2._8_8_ = 0;
    auVar2._0_2_ = local_10._M_elems[0].value;
    auVar2._2_2_ = local_10._M_elems[1].value;
    auVar2._4_2_ = local_10._M_elems[2].value;
    auVar2._6_2_ = local_10._M_elems[3].value;
    auVar2 = pshuflw(auVar2,auVar2,0x39);
    *value = auVar2._0_8_;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quath *value) {
  value::half4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}